

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_text_runes(nk_str *str,nk_rune *text,int len)

{
  char local_30 [4];
  int local_2c;
  nk_glyph glyph;
  int byte_len;
  int i;
  int len_local;
  nk_rune *text_local;
  nk_str *str_local;
  
  glyph[0] = '\0';
  glyph[1] = '\0';
  glyph[2] = '\0';
  glyph[3] = '\0';
  local_2c = 0;
  if (str != (nk_str *)0x0) {
    if (((str == (nk_str *)0x0) || (text == (nk_rune *)0x0)) || (len == 0)) {
      str_local._4_4_ = 0;
    }
    else {
      glyph[0] = '\0';
      glyph[1] = '\0';
      glyph[2] = '\0';
      glyph[3] = '\0';
      while ((str_local._4_4_ = len, (int)glyph < len &&
             (local_2c = nk_utf_encode(text[(int)glyph],local_30,4), local_2c != 0))) {
        nk_str_append_text_char(str,local_30,local_2c);
        glyph = (nk_glyph)((int)glyph + 1);
      }
    }
    return str_local._4_4_;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x2057,"int nk_str_append_text_runes(struct nk_str *, const nk_rune *, int)");
}

Assistant:

NK_API int
nk_str_append_text_runes(struct nk_str *str, const nk_rune *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_glyph glyph;

    NK_ASSERT(str);
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i) {
        byte_len = nk_utf_encode(text[i], glyph, NK_UTF_SIZE);
        if (!byte_len) break;
        nk_str_append_text_char(str, glyph, byte_len);
    }
    return len;
}